

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing_internal::DefaultPrintNonContainerTo<jhu::thrax::Span>(Span *value,ostream *os)

{
  Span SVar1;
  ostream *poVar2;
  char local_b [3];
  
  SVar1 = *value;
  local_b[0] = '[';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_b,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,SVar1.start);
  local_b[1] = 0x2c;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_b + 1,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,SVar1.end);
  local_b[2] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_b + 2,1);
  return;
}

Assistant:

void DefaultPrintNonContainerTo(const T& value, ::std::ostream* os) {
  // With the following statement, during unqualified name lookup,
  // testing::internal2::operator<< appears as if it was declared in
  // the nearest enclosing namespace that contains both
  // ::testing_internal and ::testing::internal2, i.e. the global
  // namespace.  For more details, refer to the C++ Standard section
  // 7.3.4-1 [namespace.udir].  This allows us to fall back onto
  // testing::internal2::operator<< in case T doesn't come with a <<
  // operator.
  //
  // We cannot write 'using ::testing::internal2::operator<<;', which
  // gcc 3.3 fails to compile due to a compiler bug.
  using namespace ::testing::internal2;  // NOLINT

  // Assuming T is defined in namespace foo, in the next statement,
  // the compiler will consider all of:
  //
  //   1. foo::operator<< (thanks to Koenig look-up),
  //   2. ::operator<< (as the current namespace is enclosed in ::),
  //   3. testing::internal2::operator<< (thanks to the using statement above).
  //
  // The operator<< whose type matches T best will be picked.
  //
  // We deliberately allow #2 to be a candidate, as sometimes it's
  // impossible to define #1 (e.g. when foo is ::std, defining
  // anything in it is undefined behavior unless you are a compiler
  // vendor.).
  *os << value;
}